

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

void calcBias<Blob<64>,unsigned_int>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  code *in_RDI;
  byte in_R8B;
  int bitB;
  int bitA;
  int iOut;
  int iBit;
  int *cursor;
  int irep;
  uint B;
  uint A;
  Blob<64> K;
  int hashbits;
  int keybits;
  int hashbytes;
  int keybytes;
  uint32_t local_58;
  uint32_t local_54;
  int *in_stack_ffffffffffffffb0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffbc;
  Rand *in_stack_ffffffffffffffc0;
  
  Blob<64>::Blob((Blob<64> *)&stack0xffffffffffffffc4);
  for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
    if (((in_R8B & 1) != 0) && (iVar3 % (in_EDX / 10) == 0)) {
      printf(".");
    }
    Rand::rand_p(in_stack_ffffffffffffffc0,(void *)CONCAT44(in_stack_ffffffffffffffbc,iVar3),
                 (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    (*in_RDI)(&stack0xffffffffffffffc4,8,0,&stack0xffffffffffffffc0);
    in_stack_ffffffffffffffb0 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,0);
    for (local_54 = 0; (int)local_54 < 0x40; local_54 = local_54 + 1) {
      flipbit(&stack0xffffffffffffffc4,8,local_54);
      (*in_RDI)(&stack0xffffffffffffffc4,8,0,&stack0xffffffffffffffbc);
      flipbit(&stack0xffffffffffffffc4,8,local_54);
      for (local_58 = 0; (int)local_58 < 0x20; local_58 = local_58 + 1) {
        uVar1 = getbit(&stack0xffffffffffffffc0,4,local_58);
        uVar2 = getbit(&stack0xffffffffffffffbc,4,local_58);
        *in_stack_ffffffffffffffb0 = (uVar1 ^ uVar2) + *in_stack_ffffffffffffffb0;
        in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + 1;
      }
    }
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}